

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<SignedLong_Signed_Test>::CreateTest
          (ParameterizedTestFactory<SignedLong_Signed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<long>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_00235158;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SignedLong_Signed_Test_00235198;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }